

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffload.c
# Opt level: O3

void cff_vstore_done(CFF_VStoreRec *vstore,FT_Memory memory)

{
  CFF_VarRegion *P;
  CFF_VarData *P_00;
  ulong uVar1;
  long lVar2;
  
  P = vstore->varRegionList;
  if (P == (CFF_VarRegion *)0x0) {
    P = (CFF_VarRegion *)0x0;
  }
  else if (vstore->regionCount != 0) {
    uVar1 = 0;
    do {
      ft_mem_free(memory,P[uVar1].axisList);
      P = vstore->varRegionList;
      P[uVar1].axisList = (CFF_AxisCoords *)0x0;
      uVar1 = uVar1 + 1;
    } while (uVar1 < vstore->regionCount);
  }
  ft_mem_free(memory,P);
  vstore->varRegionList = (CFF_VarRegion *)0x0;
  P_00 = vstore->varData;
  if (P_00 == (CFF_VarData *)0x0) {
    P_00 = (CFF_VarData *)0x0;
  }
  else if (vstore->dataCount != 0) {
    lVar2 = 8;
    uVar1 = 0;
    do {
      ft_mem_free(memory,*(void **)((long)&P_00->regionIdxCount + lVar2));
      P_00 = vstore->varData;
      *(undefined8 *)((long)&P_00->regionIdxCount + lVar2) = 0;
      uVar1 = uVar1 + 1;
      lVar2 = lVar2 + 0x10;
    } while (uVar1 < vstore->dataCount);
  }
  ft_mem_free(memory,P_00);
  vstore->varData = (CFF_VarData *)0x0;
  return;
}

Assistant:

static void
  cff_vstore_done( CFF_VStoreRec*  vstore,
                   FT_Memory       memory )
  {
    FT_UInt  i;


    /* free regionList and axisLists */
    if ( vstore->varRegionList )
    {
      for ( i = 0; i < vstore->regionCount; i++ )
        FT_FREE( vstore->varRegionList[i].axisList );
    }
    FT_FREE( vstore->varRegionList );

    /* free varData and indices */
    if ( vstore->varData )
    {
      for ( i = 0; i < vstore->dataCount; i++ )
        FT_FREE( vstore->varData[i].regionIndices );
    }
    FT_FREE( vstore->varData );
  }